

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrinterTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupPrinter::~TEST_GROUP_CppUTestGroupPrinter
          (TEST_GROUP_CppUTestGroupPrinter *this)

{
  TEST_GROUP_CppUTestGroupPrinter *this_local;
  
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(Printer)
{
    Printer* printer;
    MockPrinter* mockPrinter;

    void setup() _override
    {
        mockPrinter = new MockPrinter();
        printer = mockPrinter;
    }
    void teardown() _override
    {
        delete printer;
    }
}